

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O3

void __thiscall capnp::_::BuilderArena::LocalCapTable::dropCap(LocalCapTable *this,uint index)

{
  Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *pMVar1;
  Disposer *pDVar2;
  ClientHook *pCVar3;
  ulong uVar4;
  uint index_local;
  DebugComparison<unsigned_int_&,_unsigned_long> _kjCondition;
  Fault f;
  
  _kjCondition.left = &index_local;
  pMVar1 = (this->capTable).builder.ptr;
  _kjCondition.right = (long)(this->capTable).builder.pos - (long)pMVar1 >> 4;
  uVar4 = (ulong)index;
  _kjCondition.op.content.ptr = " < ";
  _kjCondition.op.content.size_ = 4;
  _kjCondition.result = uVar4 < _kjCondition.right;
  index_local = index;
  if (uVar4 < _kjCondition.right) {
    pDVar2 = pMVar1[uVar4].ptr.disposer;
    pCVar3 = pMVar1[uVar4].ptr.ptr;
    pMVar1[uVar4].ptr.disposer = (Disposer *)0x0;
    pMVar1[uVar4].ptr.ptr = (ClientHook *)0x0;
    if (pCVar3 != (ClientHook *)0x0) {
      (**pDVar2->_vptr_Disposer)
                (pDVar2,(_func_int *)
                        ((long)&pCVar3->_vptr_ClientHook + (long)pCVar3->_vptr_ClientHook[-2]));
    }
  }
  else {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_long>&,char_const(&)[42]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/arena.c++"
               ,0x180,FAILED,"index < capTable.size()",
               "_kjCondition,\"Invalid capability descriptor in message.\"",&_kjCondition,
               (char (*) [42])"Invalid capability descriptor in message.");
    kj::_::Debug::Fault::~Fault(&f);
  }
  return;
}

Assistant:

void BuilderArena::LocalCapTable::dropCap(uint index) {
#if CAPNP_LITE
  KJ_UNIMPLEMENTED("no cap tables in lite mode");
#else
  KJ_ASSERT(index < capTable.size(), "Invalid capability descriptor in message.") {
    return;
  }
  capTable[index] = kj::none;
#endif
}